

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O2

int f1(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  
  pdVar3 = *(double **)((long)y->content + 0x10);
  dVar1 = *pdVar3;
  dVar2 = pdVar3[1];
  pdVar3 = *(double **)((long)ydot->content + 0x10);
  *pdVar3 = dVar2;
  pdVar3[1] = (1.0 - dVar1 * dVar1) * 3.0 * dVar2 - dVar1;
  return 0;
}

Assistant:

static int f1(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype y0, y1;

  y0 = NV_Ith_S(y, 0);
  y1 = NV_Ith_S(y, 1);

  NV_Ith_S(ydot, 0) = y1;
  NV_Ith_S(ydot, 1) = (ONE - SQR(y0)) * P1_ETA * y1 - y0;

  return (0);
}